

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

uint32_t lys_module_pos(lys_module *module)

{
  uint uVar1;
  ly_ctx *ctx;
  ulong uVar2;
  ulong uVar3;
  
  ctx = module->ctx;
  uVar1 = (ctx->models).used;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
             ,0x12d1);
      return 0;
    }
    if ((ctx->models).list[uVar3] == module) break;
    uVar3 = uVar3 + 1;
  }
  return (int)uVar3 + 1;
}

Assistant:

static uint32_t
lys_module_pos(struct lys_module *module)
{
    int i;
    uint32_t pos = 1;

    for (i = 0; i < module->ctx->models.used; ++i) {
        if (module->ctx->models.list[i] == module) {
            return pos;
        }
        ++pos;
    }

    LOGINT(module->ctx);
    return 0;
}